

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O2

int decodeInstruction(InternalInstruction *insn,byteReader_t reader,void *readerArg,
                     uint64_t startLoc,DisassemblerMode mode)

{
  DisassemblerMode DVar1;
  VectorExtensionType VVar2;
  uint64_t uVar3;
  Reg RVar4;
  short sVar5;
  x86_op_id_pair *pxVar6;
  byte bVar7;
  uint8_t uVar8;
  int iVar9;
  ulong uVar10;
  byte bVar11;
  short sVar12;
  uint uVar13;
  ushort uVar14;
  ulong uVar15;
  uint8_t *byte_00;
  uint8_t uVar16;
  OpcodeType OVar17;
  OperandSpecifier (*paOVar18) [6];
  uint8_t uVar19;
  ushort uVar20;
  uint16_t attrMask;
  uint uVar21;
  undefined4 uVar22;
  long lVar23;
  bool bVar24;
  bool bVar25;
  long lStack_60;
  uint8_t byte;
  uint8_t local_51;
  uint16_t instructionID;
  uint8_t byte1;
  uint8_t nextByte;
  uint local_4c;
  undefined4 local_48;
  byte local_41;
  uint8_t byte1_1;
  uint8_t byte1_2;
  uint8_t byte1_3;
  uint8_t byte2;
  ushort local_3c;
  uint16_t instructionIDWithOpsize;
  _Bool *local_38;
  
  insn->reader = reader;
  insn->readerArg = readerArg;
  insn->startLocation = startLoc;
  insn->readerCursor = startLoc;
  insn->mode = mode;
  byte = '\0';
  local_38 = &insn->isPrefix2e;
  bVar25 = true;
  local_48 = 0;
  local_4c = 0;
  while (uVar22 = local_48, uVar13 = local_4c, bVar25) {
    if (insn->mode == MODE_64BIT) {
      iVar9 = consumeByte(insn,&byte);
      if (iVar9 != 0) {
        return -1;
      }
      if ((byte & 0xf0) == 0x40) {
        while( true ) {
          iVar9 = (*insn->reader)((reader_info *)insn->readerArg,&byte,insn->readerCursor);
          if (iVar9 != 0) {
            return -1;
          }
          if ((byte & 0xf0) != 0x40) break;
          iVar9 = consumeByte(insn,&byte);
          if (iVar9 != 0) {
            return -1;
          }
        }
        if ((((byte - 0x2e < 0x3a) &&
             ((0x3c0000000010101U >> ((ulong)(byte - 0x2e) & 0x3f) & 1) != 0)) ||
            ((byte - 0xf0 < 4 && (byte - 0xf0 != 1)))) || (byte == '&')) goto LAB_0019d753;
      }
      insn->readerCursor = insn->readerCursor - 1;
    }
LAB_0019d753:
    uVar3 = insn->readerCursor;
    iVar9 = consumeByte(insn,&byte);
    if (iVar9 != 0) {
      return -1;
    }
    if ((byte & 0xfe) == 0xf2 && insn->readerCursor - 1 == insn->startLocation) {
      iVar9 = (*insn->reader)((reader_info *)insn->readerArg,&nextByte,insn->readerCursor);
      if (iVar9 != 0) {
        return -1;
      }
      if ((byte & 0xfe) == 0xf2) {
        if (((nextByte == 0xf0) || ((nextByte & 0xfe) == 0x86)) || ((nextByte & 0xfffffff8) == 0x90)
           ) {
          insn->xAcquireRelease = true;
        }
        if (((byte == 0xf3) && (uVar13 = nextByte - 0x88, uVar13 < 0x40)) &&
           ((0xc000000000000003U >> ((ulong)uVar13 & 0x3f) & 1) != 0)) {
          insn->xAcquireRelease = true;
        }
      }
      if ((insn->mode == MODE_64BIT) && ((nextByte & 0xf0) == 0x40)) {
        iVar9 = consumeByte(insn,&nextByte);
        if (iVar9 != 0) {
          return -1;
        }
        iVar9 = (*insn->reader)((reader_info *)insn->readerArg,&nextByte,insn->readerCursor);
        if (iVar9 != 0) {
          return -1;
        }
        insn->readerCursor = insn->readerCursor - 1;
      }
    }
    if (byte - 100 < 4) {
      iVar9 = (*(code *)(&DAT_001e8780 + *(int *)(&DAT_001e8780 + (ulong)(byte - 100) * 4)))();
      return iVar9;
    }
    if ((byte - 0xf0 < 4) && (byte - 0xf0 != 1)) {
      insn->isPrefixf3 = false;
      insn->isPrefixf0 = false;
      insn->isPrefixf2 = false;
      if (byte == 0xf3) {
        insn->isPrefixf3 = true;
        lStack_60 = 0x60;
LAB_0019da1d:
        *(uint64_t *)(&insn->operandSize + lStack_60) = uVar3;
      }
      else {
        if (byte == 0xf2) {
          insn->isPrefixf2 = true;
          lStack_60 = 0x58;
          goto LAB_0019da1d;
        }
        if (byte == 0xf0) {
          insn->isPrefixf0 = true;
          lStack_60 = 0x50;
          goto LAB_0019da1d;
        }
      }
      insn->prefix0 = byte;
      bVar25 = true;
    }
    else if (byte == '&') {
      insn->segmentOverride = SEG_OVERRIDE_ES;
      local_38[4] = false;
      local_38[0] = false;
      local_38[1] = false;
      local_38[2] = false;
      local_38[3] = false;
      insn->isPrefix26 = true;
      insn->prefix26 = uVar3;
      insn->prefix1 = '&';
      bVar25 = true;
    }
    else if (byte == '.') {
      insn->segmentOverride = SEG_OVERRIDE_CS;
      insn->isPrefix64 = false;
      insn->isPrefix65 = false;
      insn->isPrefix26 = false;
      insn->isPrefix2e = false;
      insn->isPrefix36 = false;
      insn->isPrefix3e = false;
      insn->isPrefix2e = true;
      insn->prefix2e = uVar3;
      insn->prefix1 = '.';
      bVar25 = true;
    }
    else if (byte == '6') {
      insn->segmentOverride = SEG_OVERRIDE_SS;
      insn->isPrefix64 = false;
      insn->isPrefix65 = false;
      insn->isPrefix26 = false;
      insn->isPrefix2e = false;
      insn->isPrefix36 = false;
      insn->isPrefix3e = false;
      insn->isPrefix36 = true;
      insn->prefix36 = uVar3;
      insn->prefix1 = '6';
      bVar25 = true;
    }
    else {
      bVar25 = false;
      if (byte == '>') {
        insn->segmentOverride = SEG_OVERRIDE_DS;
        insn->isPrefix64 = false;
        insn->isPrefix65 = false;
        insn->isPrefix26 = false;
        insn->isPrefix2e = false;
        insn->isPrefix36 = false;
        insn->isPrefix3e = false;
        insn->isPrefix3e = true;
        insn->prefix3e = uVar3;
        insn->prefix1 = '>';
        bVar25 = true;
      }
    }
  }
  insn->vectorExtensionType = TYPE_NO_VEX_XOP;
  OVar17 = TWOBYTE;
  uVar21 = local_4c & 0xff;
  if (byte == 0xc5) {
    iVar9 = (*insn->reader)((reader_info *)insn->readerArg,&byte1_2,insn->readerCursor);
    if (iVar9 != 0) {
      return -1;
    }
    if ((insn->mode == MODE_64BIT) || (0xbf < byte1_2)) {
      insn->vectorExtensionType = TYPE_VEX_2B;
    }
    else {
      insn->readerCursor = insn->readerCursor - 1;
      uVar22 = local_48;
      if (insn->vectorExtensionType != TYPE_VEX_2B) goto LAB_0019de2f;
    }
    insn->vectorExtensionPrefix[0] = byte;
    iVar9 = consumeByte(insn,insn->vectorExtensionPrefix + 1);
    if (iVar9 != 0) {
      return -1;
    }
    bVar7 = insn->vectorExtensionPrefix[1];
    if (insn->mode == MODE_64BIT) {
      insn->rexPrefix = (byte)~bVar7 >> 5 & 4 | 0x40;
    }
    uVar13 = uVar21;
    uVar22 = local_48;
    if ((bVar7 & 3) == 1) {
      uVar13 = 1;
    }
  }
  else if (byte == 0x8f) {
    iVar9 = (*insn->reader)((reader_info *)insn->readerArg,&byte1_1,insn->readerCursor);
    if (iVar9 != 0) {
      return -1;
    }
    if ((byte1_1 & 0x38) == 0) {
      uVar3 = insn->readerCursor;
      insn->readerCursor = uVar3 - 1;
      insn->necessaryPrefixLocation = uVar3 - 2;
      uVar22 = local_48;
      if (insn->vectorExtensionType != TYPE_XOP) goto LAB_0019de2f;
    }
    else {
      insn->vectorExtensionType = TYPE_XOP;
      insn->necessaryPrefixLocation = insn->readerCursor - 1;
    }
    insn->vectorExtensionPrefix[0] = byte;
    iVar9 = consumeByte(insn,insn->vectorExtensionPrefix + 1);
    if (iVar9 != 0) {
      return -1;
    }
    iVar9 = consumeByte(insn,insn->vectorExtensionPrefix + 2);
    if (iVar9 != 0) {
      return -1;
    }
    bVar7 = insn->vectorExtensionPrefix[2];
    if (insn->mode == MODE_64BIT) {
      insn->rexPrefix = (byte)~insn->vectorExtensionPrefix[1] >> 5 | bVar7 >> 4 & 8 | 0x40;
    }
    uVar13 = uVar21;
    uVar22 = local_48;
    if ((bVar7 & 3) == 1) {
      uVar13 = 1;
    }
  }
  else if (byte == 0xc4) {
    iVar9 = (*insn->reader)((reader_info *)insn->readerArg,&byte1_3,insn->readerCursor);
    uVar22 = local_48;
    if (iVar9 != 0) {
      return -1;
    }
    if ((insn->mode == MODE_64BIT) || (0xbf < byte1_3)) {
      insn->vectorExtensionType = TYPE_VEX_3B;
      insn->necessaryPrefixLocation = insn->readerCursor - 1;
    }
    else {
      uVar3 = insn->readerCursor;
      insn->readerCursor = uVar3 - 1;
      insn->necessaryPrefixLocation = uVar3 - 2;
      if (insn->vectorExtensionType != TYPE_VEX_3B) goto LAB_0019de2f;
    }
    insn->vectorExtensionPrefix[0] = byte;
    iVar9 = consumeByte(insn,insn->vectorExtensionPrefix + 1);
    if (iVar9 != 0) {
      return -1;
    }
    byte_00 = insn->vectorExtensionPrefix + 2;
LAB_0019dcd1:
    iVar9 = consumeByte(insn,byte_00);
    if (iVar9 != 0) {
      return -1;
    }
    if (insn->mode == MODE_64BIT) {
      insn->rexPrefix =
           (byte)~insn->vectorExtensionPrefix[1] >> 5 | insn->vectorExtensionPrefix[2] >> 4 & 8 |
           0x40;
    }
  }
  else if (byte == 'b') {
    iVar9 = consumeByte(insn,&byte1);
    if (iVar9 != 0) {
      return -1;
    }
    if ((byte1 & 0xc) == 0 && (0xbf < byte1 || insn->mode == MODE_64BIT)) {
      iVar9 = (*insn->reader)((reader_info *)insn->readerArg,&byte2,insn->readerCursor);
      if (iVar9 != 0) {
        return -1;
      }
      if ((byte2 & 4) == 0) {
        uVar3 = insn->readerCursor;
        insn->readerCursor = uVar3 - 2;
        insn->necessaryPrefixLocation = uVar3 - 4;
        if (insn->vectorExtensionType != TYPE_EVEX) goto LAB_0019de2f;
      }
      else {
        insn->vectorExtensionType = TYPE_EVEX;
      }
      insn->vectorExtensionPrefix[0] = byte;
      insn->vectorExtensionPrefix[1] = byte1;
      iVar9 = consumeByte(insn,insn->vectorExtensionPrefix + 2);
      if (iVar9 != 0) {
        return -1;
      }
      byte_00 = insn->vectorExtensionPrefix + 3;
      goto LAB_0019dcd1;
    }
    insn->readerCursor = insn->readerCursor - 2;
  }
  else if ((insn->mode == MODE_64BIT) && ((byte & 0xf0) == 0x40)) {
    while( true ) {
      iVar9 = (*insn->reader)((reader_info *)insn->readerArg,&local_41,insn->readerCursor);
      if (iVar9 != 0) {
        return -1;
      }
      if ((local_41 & 0xf0) != 0x40) break;
      iVar9 = consumeByte(insn,&byte);
      if (iVar9 != 0) {
        return -1;
      }
    }
    insn->rexPrefix = byte;
    insn->necessaryPrefixLocation = insn->readerCursor - 2;
    uVar22 = local_48;
  }
  else {
    uVar3 = insn->readerCursor;
    insn->readerCursor = uVar3 - 1;
    insn->necessaryPrefixLocation = uVar3 - 2;
  }
LAB_0019de2f:
  DVar1 = insn->mode;
  bVar7 = ~(byte)uVar22;
  bVar11 = ~(byte)uVar13;
  if (DVar1 == MODE_64BIT) {
    if ((insn->rexPrefix & 8) != 0) {
      insn->registerSize = '\b';
      uVar19 = (bVar7 & 1) * '\x04' + '\x04';
      uVar16 = '\x04';
      uVar8 = '\x04';
      goto LAB_0019deee;
    }
    bVar11 = bVar11 & 1;
    uVar16 = bVar11 * '\x02' + '\x02';
    insn->registerSize = uVar16;
    insn->addressSize = (bVar7 & 1) * '\x04' + '\x04';
    insn->displacementSize = uVar16;
    insn->immediateSize = uVar16;
    if (insn->rexPrefix == 0) {
      uVar16 = bVar11 * '\x04' + '\x04';
    }
LAB_0019df02:
    insn->immSize = uVar16;
  }
  else {
    if (DVar1 == MODE_32BIT) {
      uVar16 = (bVar11 & 1) * '\x02' + '\x02';
      insn->registerSize = uVar16;
      uVar19 = (bVar7 & 1) * '\x02' + '\x02';
      uVar8 = uVar19;
LAB_0019deee:
      insn->addressSize = uVar19;
      insn->displacementSize = uVar8;
      insn->immediateSize = uVar16;
      goto LAB_0019df02;
    }
    if (DVar1 == MODE_16BIT) {
      uVar16 = ((byte)uVar13 & 1) * '\x02' + '\x02';
      insn->registerSize = uVar16;
      uVar19 = ((byte)uVar22 & 1) * '\x02' + '\x02';
      uVar8 = uVar19;
      goto LAB_0019deee;
    }
  }
  insn->opcodeType = ONEBYTE;
  switch(insn->vectorExtensionType) {
  case TYPE_VEX_2B:
switchD_0019df35_caseD_1:
    insn->twoByteEscape = '\x0f';
    break;
  case TYPE_VEX_3B:
    bVar7 = insn->vectorExtensionPrefix[1] & 0x1f;
    if (bVar7 != 3) {
      if (bVar7 == 2) {
        insn->twoByteEscape = '\x0f';
        insn->threeByteEscape = '8';
        goto switchD_0019df5a_caseD_2;
      }
      if (bVar7 != 1) {
        return -1;
      }
      goto switchD_0019df35_caseD_1;
    }
    insn->twoByteEscape = '\x0f';
    insn->threeByteEscape = ':';
switchD_0019df5a_caseD_3:
    OVar17 = THREEBYTE_3A;
    break;
  case TYPE_EVEX:
    OVar17 = insn->vectorExtensionPrefix[1] & THREEBYTE_3A;
    switch(OVar17) {
    case ONEBYTE:
      return -1;
    case THREEBYTE_38:
switchD_0019df5a_caseD_2:
      OVar17 = THREEBYTE_38;
      break;
    case THREEBYTE_3A:
      goto switchD_0019df5a_caseD_3;
    }
    break;
  case TYPE_XOP:
    uVar13 = insn->vectorExtensionPrefix[1] & 0x1f;
    if (2 < (byte)((char)uVar13 - 8U)) {
      return -1;
    }
    OVar17 = uVar13 - XOP8_MAP;
    break;
  default:
    iVar9 = consumeByte(insn,&local_51);
    if (iVar9 != 0) {
      return -1;
    }
    insn->firstByte = local_51;
    if (local_51 == '\x0f') {
      insn->twoByteEscape = '\x0f';
      iVar9 = consumeByte(insn,&local_51);
      if (iVar9 != 0) {
        return -1;
      }
      if (local_51 == '\x0e') {
        insn->opcodeType = T3DNOW_MAP;
        insn->consumedModRM = true;
      }
      else if (local_51 == '\x0f') {
        iVar9 = readModRM(insn);
        if (iVar9 != 0) {
          return -1;
        }
        iVar9 = consumeByte(insn,&local_51);
        if (iVar9 != 0) {
          return -1;
        }
        insn->opcodeType = T3DNOW_MAP;
      }
      else if (local_51 == ':') {
        insn->threeByteEscape = ':';
        iVar9 = consumeByte(insn,&local_51);
        if (iVar9 != 0) {
          return -1;
        }
        insn->opcodeType = THREEBYTE_3A;
      }
      else if (local_51 == '8') {
        insn->threeByteEscape = '8';
        iVar9 = consumeByte(insn,&local_51);
        if (iVar9 != 0) {
          return -1;
        }
        insn->opcodeType = THREEBYTE_38;
      }
      else {
        insn->opcodeType = TWOBYTE;
      }
    }
    insn->opcode = local_51;
    goto LAB_0019e067;
  }
  insn->opcodeType = OVar17;
  iVar9 = consumeByte(insn,&insn->opcode);
  if (iVar9 != 0) {
    return -1;
  }
LAB_0019e067:
  VVar2 = insn->vectorExtensionType;
  bVar25 = insn->mode == MODE_64BIT;
  uVar14 = (ushort)bVar25;
  if (VVar2 == TYPE_NO_VEX_XOP) {
    if (((insn->mode == MODE_16BIT) || (insn->isPrefix66 != true)) ||
       (insn->prefix66 != insn->necessaryPrefixLocation)) {
      uVar3 = insn->necessaryPrefixLocation;
      if ((insn->isPrefix67 == true) && (insn->prefix67 == uVar3)) {
        uVar20 = uVar14 | 0x20;
      }
      else if ((insn->isPrefixf3 == true) && (insn->prefixf3 == uVar3)) {
        uVar20 = uVar14 | 2;
      }
      else {
        uVar20 = (ushort)bVar25;
        if ((insn->isPrefixf2 == true) && (uVar20 = (ushort)bVar25, insn->prefixf2 == uVar3)) {
          uVar20 = uVar14 + 4;
        }
      }
    }
    else {
      uVar20 = uVar14 | 0x10;
    }
  }
  else {
    uVar20 = 0x40;
    if (VVar2 == TYPE_EVEX) {
      uVar20 = 0x100;
    }
    uVar20 = uVar20 | uVar14;
    if (VVar2 == TYPE_EVEX) {
      switch(insn->vectorExtensionPrefix[2] & 3) {
      case 1:
        uVar20 = uVar20 | 0x10;
        break;
      case 2:
        uVar20 = uVar20 | 2;
        break;
      case 3:
        uVar20 = uVar20 | 4;
      }
      bVar7 = insn->vectorExtensionPrefix[3];
      if ((char)bVar7 < '\0') {
        uVar20 = uVar20 + 0x1000;
      }
      sVar12 = (bVar7 & 0x10) * 0x200;
      sVar5 = sVar12 + 0x800;
      if ((bVar7 & 7) == 0) {
        sVar5 = sVar12;
      }
      uVar20 = (bVar7 & 0x60) << 4 | sVar5 + uVar20;
    }
    else {
      if (VVar2 == TYPE_VEX_2B) {
        uVar14 = (ushort)insn->vectorExtensionPrefix[1];
        switch(insn->vectorExtensionPrefix[1] & 3) {
        case 1:
          goto switchD_0019e128_caseD_1;
        case 2:
          goto switchD_0019e128_caseD_2;
        case 3:
          goto switchD_0019e128_caseD_3;
        }
      }
      else if (VVar2 == TYPE_XOP) {
        uVar14 = (ushort)insn->vectorExtensionPrefix[2];
        switch(insn->vectorExtensionPrefix[2] & 3) {
        case 1:
          goto switchD_0019e128_caseD_1;
        case 2:
          goto switchD_0019e128_caseD_2;
        case 3:
          goto switchD_0019e128_caseD_3;
        }
      }
      else {
        if (VVar2 != TYPE_VEX_3B) {
          return -1;
        }
        uVar14 = (ushort)insn->vectorExtensionPrefix[2];
        switch(insn->vectorExtensionPrefix[2] & 3) {
        case 1:
switchD_0019e128_caseD_1:
          uVar20 = uVar20 | 0x10;
          break;
        case 2:
switchD_0019e128_caseD_2:
          uVar20 = uVar20 | 2;
          break;
        case 3:
switchD_0019e128_caseD_3:
          uVar20 = uVar20 | 4;
        }
      }
      uVar20 = uVar20 | (uVar14 & 4) << 5;
    }
  }
  attrMask = uVar20 | insn->rexPrefix & 8;
  iVar9 = getIDWithAttrMask(&instructionID,insn,attrMask);
  if (iVar9 != 0) {
    return -1;
  }
  if (insn->mode == MODE_16BIT) {
    if ((insn->opcode == 0xe3) && (x86DisassemblerInstrSpecifiers[instructionID].operands == 0x9c))
    {
      attrMask = attrMask ^ 0x20;
      iVar9 = getIDWithAttrMask(&instructionID,insn,attrMask);
      if (iVar9 != 0) {
        return -1;
      }
      if (insn->mode != MODE_16BIT) goto LAB_0019e270;
    }
    if ((attrMask & 0x10) == 0) goto LAB_0019e284;
LAB_0019e31e:
    if (((insn->opcodeType == ONEBYTE) && (insn->opcode == 0x90)) && ((insn->rexPrefix & 1) != 0)) {
      insn->opcode = 0x91;
      iVar9 = getIDWithAttrMask(&local_3c,insn,attrMask);
      if (iVar9 == 0) {
        instructionID = local_3c;
      }
      uVar13 = (uint)instructionID;
      insn->opcode = 0x90;
      insn->instructionID = instructionID;
      insn->spec = x86DisassemblerInstrSpecifiers + instructionID;
    }
    else {
      uVar13 = (uint)instructionID;
      insn->instructionID = instructionID;
      insn->spec = x86DisassemblerInstrSpecifiers + instructionID;
    }
  }
  else {
LAB_0019e270:
    if (((attrMask & 0x10) != 0) || (insn->isPrefix66 == false)) goto LAB_0019e31e;
LAB_0019e284:
    iVar9 = getIDWithAttrMask(&instructionIDWithOpsize,insn,attrMask | 0x10);
    if ((iVar9 == 0) && (x86_16_bit_eq_lookup[instructionID] != 0)) {
      uVar10 = (ulong)instructionIDWithOpsize;
      uVar15 = (ulong)(x86_16_bit_eq_lookup[instructionID] - 1);
      do {
        if ((0x380 < uVar15) || (x86_16_bit_eq_tbl[uVar15].first != instructionID))
        goto LAB_0019e2b9;
        pxVar6 = x86_16_bit_eq_tbl + uVar15;
        uVar15 = uVar15 + 1;
      } while (pxVar6->second != instructionIDWithOpsize);
      if (insn->isPrefix66 == (insn->mode == MODE_16BIT)) goto LAB_0019e2b9;
      insn->instructionID = instructionIDWithOpsize;
      instructionID = instructionIDWithOpsize;
    }
    else {
LAB_0019e2b9:
      insn->instructionID = instructionID;
      uVar10 = (ulong)instructionID;
    }
    uVar13 = (uint)instructionID;
    insn->spec = x86DisassemblerInstrSpecifiers + uVar10;
  }
  if ((short)uVar13 == 0) {
switchD_0019e731_caseD_b:
    return -1;
  }
  if (insn->isPrefixf0 == true) {
    if (((((((0x3c < uVar13 - 0x1829) ||
            ((0x181c0e0700148855U >> ((ulong)(uVar13 - 0x1829) & 0x3f) & 1) == 0)) &&
           ((0x21 < uVar13 - 0x133 || ((0x333333333U >> ((ulong)(uVar13 - 0x133) & 0x3f) & 1) == 0))
           )) && (((0x34 < uVar13 - 0x21 ||
                   ((0x1c01c0181c0e07U >> ((ulong)(uVar13 - 0x21) & 0x3f) & 1) == 0)) &&
                  ((0x3d < uVar13 - 0x70e ||
                   ((0x3c0e550000000055U >> ((ulong)(uVar13 - 0x70e) & 0x3f) & 1) == 0)))))) &&
         (((0x1c < uVar13 - 0xac || ((0x181c0e07U >> (uVar13 - 0xac & 0x1f) & 1) == 0)) &&
          ((0x1c < uVar13 - 0x9d0 || ((0x181c0e07U >> (uVar13 - 0x9d0 & 0x1f) & 1) == 0)))))) &&
        (((0x1c < uVar13 - 0xad3 || ((0x181c0e07U >> (uVar13 - 0xad3 & 0x1f) & 1) == 0)) &&
         ((8 < uVar13 - 0x23a || ((0x1abU >> (uVar13 - 0x23a & 0x1f) & 1) == 0)))))) &&
       ((((0xc < uVar13 - 0x28e || ((0x1551U >> (uVar13 - 0x28e & 0x1f) & 1) == 0)) &&
         ((0xc < uVar13 - 0x380 || ((0x1551U >> (uVar13 - 0x380 & 0x1f) & 1) == 0)))) &&
        ((0xd < uVar13 - 0x5f || ((0x3007U >> (uVar13 - 0x5f & 0x1f) & 1) == 0)))))) {
      if (10 < uVar13 - 0x752) {
        return -1;
      }
      if ((0x607U >> (uVar13 - 0x752 & 0x1f) & 1) == 0) {
        return -1;
      }
    }
  }
  else if ((insn->isPrefixf2 == true) && (insn->twoByteEscape == '\x0f')) {
    insn->prefix0 = '\0';
  }
  switch(insn->vectorExtensionType) {
  case TYPE_VEX_2B:
    bVar7 = insn->vectorExtensionPrefix[1];
    break;
  case TYPE_VEX_3B:
  case TYPE_XOP:
    bVar7 = insn->vectorExtensionPrefix[2];
    break;
  case TYPE_EVEX:
    bVar7 = (insn->vectorExtensionPrefix[2] >> 3 & 0xf |
            insn->vectorExtensionPrefix[3] * '\x02' & 0x10) ^ 0x1f;
    goto LAB_0019e6c9;
  default:
    local_48 = 0;
    bVar25 = false;
    goto LAB_0019e6f0;
  }
  bVar7 = (byte)~bVar7 >> 3 & 0xf;
LAB_0019e6c9:
  RVar4 = bVar7 & MODRM_REG_BH;
  if (insn->mode == MODE_64BIT) {
    RVar4 = (uint)bVar7;
  }
  insn->vvvv = RVar4;
  bVar25 = RVar4 != MODRM_REG_AL;
  local_48 = 1;
LAB_0019e6f0:
  local_4c = 0;
  paOVar18 = x86OperandSets;
  lVar23 = 5;
  do {
    bVar24 = lVar23 == 0;
    lVar23 = lVar23 + -1;
    if (bVar24) {
      if (bVar25) {
        return -1;
      }
      uVar10 = insn->readerCursor - insn->startLocation;
      insn->length = uVar10;
      if (0xf < uVar10) {
        return -1;
      }
      if (insn->operandSize == '\0') {
        insn->operandSize = insn->registerSize;
      }
      insn->operands = x86OperandSets[insn->spec->operands];
      return 0;
    }
    uVar10 = (ulong)insn->spec->operands;
    switch(((OperandSpecifier *)((long)paOVar18 + uVar10 * 6 * 2))->encoding) {
    case '\0':
    case '\x19':
    case '\x1d':
    case '\x1e':
    case '\x1f':
      goto switchD_0019e731_caseD_0;
    case '\x01':
    case '\x02':
    case '\x03':
    case '\x04':
    case '\x05':
    case '\x06':
    case '\a':
    case '\b':
      iVar9 = readModRM(insn);
      if (iVar9 != 0) {
        return -1;
      }
      iVar9 = fixupReg(insn,(OperandSpecifier *)
                            ((long)paOVar18 + (ulong)insn->spec->operands * 6 * 2));
      if (iVar9 != 0) {
        return -1;
      }
      if ((((OperandSpecifier *)((long)paOVar18 + (ulong)insn->spec->operands * 6 * 2))->encoding !=
           '\x01') && (insn->eaDisplacement == EA_DISP_8)) {
        insn->displacement =
             insn->displacement <<
             (((OperandSpecifier *)((long)paOVar18 + (ulong)insn->spec->operands * 6 * 2))->encoding
              - 2 & 0x1f);
      }
      goto switchD_0019e731_caseD_0;
    case '\t':
      if ((char)local_48 == '\0') {
        return -1;
      }
      iVar9 = fixupReg(insn,(OperandSpecifier *)((long)paOVar18 + uVar10 * 6 * 2));
      bVar25 = false;
      goto LAB_0019e862;
    case '\n':
      if (insn->vectorExtensionType != TYPE_EVEX) {
        return -1;
      }
      insn->writemask = insn->vectorExtensionPrefix[3] & MODRM_REG_BH;
      goto switchD_0019e731_caseD_0;
    default:
      goto switchD_0019e731_caseD_b;
    case '\x11':
      if (local_4c == 0) {
        iVar9 = readImmediate(insn,'\x01');
        if (iVar9 != 0) {
          return -1;
        }
        local_4c = (uint)((byte)(((OperandSpecifier *)
                                 ((long)paOVar18 + (ulong)insn->spec->operands * 6 * 2))->type -
                                0x3f) < 2);
      }
      else {
        bVar7 = insn->numImmediatesConsumed;
        insn->immediates[bVar7] = (ulong)((uint)insn->immediates[(ulong)bVar7 - 1] & 0xf);
        insn->numImmediatesConsumed = bVar7 + 1;
        local_4c = 1;
      }
      goto switchD_0019e731_caseD_0;
    case '\x12':
      uVar16 = '\x02';
      break;
    case '\x13':
      uVar16 = '\x04';
      break;
    case '\x14':
      uVar16 = '\b';
      break;
    case '\x15':
      uVar16 = '\x01';
      goto LAB_0019e81a;
    case '\x16':
      uVar16 = '\x02';
      goto LAB_0019e81a;
    case '\x17':
      uVar16 = '\x04';
      goto LAB_0019e81a;
    case '\x18':
      uVar16 = '\b';
      goto LAB_0019e81a;
    case '\x1a':
      uVar16 = insn->immediateSize;
      break;
    case '\x1b':
      uVar16 = insn->addressSize;
      break;
    case '\x1c':
      uVar16 = '\0';
LAB_0019e81a:
      readOpcodeRegister(insn,uVar16);
      goto switchD_0019e731_caseD_0;
    }
    iVar9 = readImmediate(insn,uVar16);
LAB_0019e862:
    if (iVar9 != 0) {
      return -1;
    }
switchD_0019e731_caseD_0:
    paOVar18 = (OperandSpecifier (*) [6])((long)paOVar18 + 2);
  } while( true );
}

Assistant:

int decodeInstruction(struct InternalInstruction *insn,
		byteReader_t reader,
		const void *readerArg,
		uint64_t startLoc,
		DisassemblerMode mode)
{
	insn->reader = reader;
	insn->readerArg = readerArg;
	insn->startLocation = startLoc;
	insn->readerCursor = startLoc;
	insn->mode = mode;

	if (readPrefixes(insn)       ||
			readOpcode(insn)         ||
			getID(insn)      ||
			insn->instructionID == 0 ||
			checkPrefix(insn) ||
			readOperands(insn))
		return -1;

	insn->length = (size_t)(insn->readerCursor - insn->startLocation);

	// instruction length must be <= 15 to be valid
	if (insn->length > 15)
		return -1;

	if (insn->operandSize == 0)
		insn->operandSize = insn->registerSize;

	insn->operands = &x86OperandSets[insn->spec->operands][0];

	// dbgprintf(insn, "Read from 0x%llx to 0x%llx: length %zu",
	// 		startLoc, insn->readerCursor, insn->length);

	//if (insn->length > 15)
	//	dbgprintf(insn, "Instruction exceeds 15-byte limit");

#if 0
	printf("\n>>> x86OperandSets = %lu\n", sizeof(x86OperandSets));
	printf(">>> x86DisassemblerInstrSpecifiers = %lu\n", sizeof(x86DisassemblerInstrSpecifiers));
	printf(">>> x86DisassemblerContexts = %lu\n", sizeof(x86DisassemblerContexts));
	printf(">>> modRMTable = %lu\n", sizeof(modRMTable));
	printf(">>> x86DisassemblerOneByteOpcodes = %lu\n", sizeof(x86DisassemblerOneByteOpcodes));
	printf(">>> x86DisassemblerTwoByteOpcodes = %lu\n", sizeof(x86DisassemblerTwoByteOpcodes));
	printf(">>> x86DisassemblerThreeByte38Opcodes = %lu\n", sizeof(x86DisassemblerThreeByte38Opcodes));
	printf(">>> x86DisassemblerThreeByte3AOpcodes = %lu\n", sizeof(x86DisassemblerThreeByte3AOpcodes));
	printf(">>> x86DisassemblerThreeByteA6Opcodes = %lu\n", sizeof(x86DisassemblerThreeByteA6Opcodes));
	printf(">>> x86DisassemblerThreeByteA7Opcodes= %lu\n", sizeof(x86DisassemblerThreeByteA7Opcodes));
	printf(">>> x86DisassemblerXOP8Opcodes = %lu\n", sizeof(x86DisassemblerXOP8Opcodes));
	printf(">>> x86DisassemblerXOP9Opcodes = %lu\n", sizeof(x86DisassemblerXOP9Opcodes));
	printf(">>> x86DisassemblerXOPAOpcodes = %lu\n\n", sizeof(x86DisassemblerXOPAOpcodes));
#endif

	return 0;
}